

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

void EDLines::UpdateLineParameters(LineSegment *ls)

{
  double dVar1;
  double dVar2;
  double dy;
  double dx;
  LineSegment *ls_local;
  
  dVar1 = ls->ex - ls->sx;
  dVar2 = ls->ey - ls->sy;
  if (ABS(dVar1) < ABS(dVar2)) {
    ls->invert = 1;
    if (0.001 <= ABS(dVar1)) {
      ls->b = dVar1 / dVar2;
      ls->a = -ls->b * ls->sy + ls->sx;
    }
    else {
      ls->b = 0.0;
      ls->a = (ls->sx + ls->ex) / 2.0;
    }
  }
  else {
    ls->invert = 0;
    if (0.001 <= ABS(dVar2)) {
      ls->b = dVar2 / dVar1;
      ls->a = -ls->b * ls->sx + ls->sy;
    }
    else {
      ls->b = 0.0;
      ls->a = (ls->sy + ls->ey) / 2.0;
    }
  }
  return;
}

Assistant:

void EDLines::UpdateLineParameters(LineSegment * ls)
{
	double dx = ls->ex - ls->sx;
	double dy = ls->ey - ls->sy;

	if (fabs(dx) >= fabs(dy)) {
		/// Line will be of the form y = a + bx
		ls->invert = 0;
		if (fabs(dy) < 1e-3) { ls->b = 0; ls->a = (ls->sy + ls->ey) / 2; }
		else {
			ls->b = dy / dx;
			ls->a = ls->sy - (ls->b)*ls->sx;
		} //end-else

	}
	else {
		/// Line will be of the form x = a + by
		ls->invert = 1;
		if (fabs(dx) < 1e-3) { ls->b = 0; ls->a = (ls->sx + ls->ex) / 2; }
		else {
			ls->b = dx / dy;
			ls->a = ls->sx - (ls->b)*ls->sy;
		} //end-else
	} //end-else
}